

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TaggedInt.cpp
# Opt level: O1

Var Js::TaggedInt::ShiftRight(Var aLeft,Var aRight)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  
  if (((ulong)aLeft & 0x1ffff00000000) != 0x1000000000000 &&
      ((ulong)aLeft & 0xffff000000000000) == 0x1000000000000) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
    if (!bVar2) goto LAB_00b1b12a;
    *puVar3 = 0;
  }
  if (((ulong)aLeft & 0xffff000000000000) != 0x1000000000000) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                ,0x43,"(Is(aValue))","Ensure var is actually a \'TaggedInt\'");
    if (!bVar2) goto LAB_00b1b12a;
    *puVar3 = 0;
  }
  if (((ulong)aRight & 0x1ffff00000000) != 0x1000000000000 &&
      ((ulong)aRight & 0xffff000000000000) == 0x1000000000000) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
    if (!bVar2) goto LAB_00b1b12a;
    *puVar3 = 0;
  }
  if (((ulong)aRight & 0xffff000000000000) != 0x1000000000000) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                ,0x51,"(Is(aValue))","Ensure var is actually a \'TaggedInt\'");
    if (!bVar2) {
LAB_00b1b12a:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  return (Var)((ulong)(uint)((int)aLeft >> ((byte)aRight & 0x1f)) | 0x1000000000000);
}

Assistant:

Var TaggedInt::ShiftRight(Var aLeft, Var aRight)
    {
        //
        // If aLeft was an Int31 coming in, then the result must always be an Int31 going out because
        // shifting right only makes value smaller. Therefore, we may call ToVarUnchecked()
        // directly.
        //

        int nValue      = ToInt32(aLeft);
        uint32 nShift   = ToUInt32(aRight);

        return ToVarUnchecked(nValue >> (nShift & 0x1F));
    }